

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,FormattedNumber *FN)

{
  uint uVar1;
  raw_ostream *S;
  size_t sVar2;
  undefined8 in_R9;
  Optional<unsigned_long> Width;
  undefined1 local_88 [8];
  raw_svector_ostream Stream;
  SmallString<16U> Buffer;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_30;
  byte local_28;
  uint local_1c;
  FormattedNumber *pFStack_18;
  HexPrintStyle Style;
  FormattedNumber *FN_local;
  raw_ostream *this_local;
  
  pFStack_18 = FN;
  FN_local = (FormattedNumber *)this;
  if ((FN->Hex & 1U) == 0) {
    SmallString<16U>::SmallString((SmallString<16U> *)&Stream.OS);
    raw_svector_ostream::raw_svector_ostream
              ((raw_svector_ostream *)local_88,(SmallVectorImpl<char> *)&Stream.OS);
    write_integer((raw_ostream *)local_88,pFStack_18->DecValue,0,Integer);
    sVar2 = SmallVectorBase::size((SmallVectorBase *)&Stream.OS);
    if (sVar2 < pFStack_18->Width) {
      uVar1 = pFStack_18->Width;
      sVar2 = SmallVectorBase::size((SmallVectorBase *)&Stream.OS);
      indent(this,uVar1 - (int)sVar2);
    }
    operator<<(this,(SmallVectorImpl<char> *)&Stream.OS);
    raw_svector_ostream::~raw_svector_ostream((raw_svector_ostream *)local_88);
    SmallString<16U>::~SmallString((SmallString<16U> *)&Stream.OS);
  }
  else {
    if (((FN->Upper & 1U) == 0) || ((FN->HexPrefix & 1U) == 0)) {
      if (((FN->Upper & 1U) == 0) || ((FN->HexPrefix & 1U) != 0)) {
        if (((FN->Upper & 1U) == 0) && ((FN->HexPrefix & 1U) != 0)) {
          local_1c = 3;
        }
        else {
          local_1c = 1;
        }
      }
      else {
        local_1c = 0;
      }
    }
    else {
      local_1c = 2;
    }
    uVar1 = local_1c;
    S = (raw_ostream *)FN->HexValue;
    Buffer.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts._8_8_ =
         ZEXT48(FN->Width);
    Optional<unsigned_long>::Optional
              ((Optional<unsigned_long> *)&local_30,
               (unsigned_long *)
               (Buffer.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts +
               8));
    Width.Storage.field_0.value._1_7_ = 0;
    Width.Storage.field_0.empty = local_28;
    Width.Storage._8_8_ = in_R9;
    llvm::write_hex((llvm *)this,S,(ulong)uVar1,local_30.value._0_4_,Width);
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::operator<<(const FormattedNumber &FN) {
  if (FN.Hex) {
    HexPrintStyle Style;
    if (FN.Upper && FN.HexPrefix)
      Style = HexPrintStyle::PrefixUpper;
    else if (FN.Upper && !FN.HexPrefix)
      Style = HexPrintStyle::Upper;
    else if (!FN.Upper && FN.HexPrefix)
      Style = HexPrintStyle::PrefixLower;
    else
      Style = HexPrintStyle::Lower;
    llvm::write_hex(*this, FN.HexValue, Style, FN.Width);
  } else {
    llvm::SmallString<16> Buffer;
    llvm::raw_svector_ostream Stream(Buffer);
    llvm::write_integer(Stream, FN.DecValue, 0, IntegerStyle::Integer);
    if (Buffer.size() < FN.Width)
      indent(FN.Width - Buffer.size());
    (*this) << Buffer;
  }
  return *this;
}